

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void testUleb(void)

{
  ulong uVar1;
  bool bVar2;
  undefined1 auVar3 [16];
  ulong uVar4;
  long lVar5;
  size_t size;
  bool bVar6;
  byte bVar7;
  C *pCVar8;
  char buffer [16];
  byte local_68 [24];
  StringRefBase<char,_axl::sl::StringDetailsBase<char>_> local_50;
  
  lVar5 = 0;
  bVar2 = true;
  do {
    bVar6 = bVar2;
    uVar1 = testUleb::values[lVar5];
    size = 0;
    uVar4 = uVar1;
    do {
      bVar7 = (byte)uVar4 | 0x80;
      if (uVar4 < 0x80) {
        bVar7 = (byte)uVar4;
      }
      local_68[size] = bVar7;
      size = size + 1;
      bVar2 = 0x7f < uVar4;
      uVar4 = uVar4 >> 7;
    } while (bVar2);
    axl::enc::HexEncoding::encode((String *)&local_50,local_68,size,0);
    pCVar8 = &axl::sl::StringDetailsImpl<char>::getEmptyString()::emptyString;
    if (local_50.m_length != 0) {
      pCVar8 = local_50.m_p;
    }
    auVar3._8_8_ = 0;
    auVar3._0_8_ = uVar1;
    printf("0x%llx (%d us, %d bps) -> %s\n",uVar1,uVar1,
           SUB168((ZEXT816(0) << 0x40 | ZEXT816(10000000)) / auVar3,0),pCVar8);
    axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::release(&local_50);
    lVar5 = 1;
    bVar2 = false;
  } while (bVar6);
  return;
}

Assistant:

void testUleb() {
	static uint64_t values[] = {
		0x13AF12,
		0x00270F,
	};

	char buffer[16];

	for (size_t i = 0; i < countof(values); i++) {
		uint64_t x = values[i];
		char* p = enc::encodeUleb128(buffer, x);
		printf("0x%llx (%d us, %d bps) -> %s\n", x, x, 1000000ULL * 10 / x, enc::HexEncoding::encode(buffer, p - buffer).sz());
	}
}